

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# NeuralNetwork.pb.cc
# Opt level: O1

FlattenLayerParams * __thiscall
CoreML::Specification::FlattenLayerParams::New(FlattenLayerParams *this,Arena *arena)

{
  FlattenLayerParams *this_00;
  
  this_00 = (FlattenLayerParams *)operator_new(0x18);
  FlattenLayerParams(this_00);
  if (arena != (Arena *)0x0) {
    google::protobuf::Arena::Own<CoreML::Specification::FlattenLayerParams>(arena,this_00);
  }
  return this_00;
}

Assistant:

FlattenLayerParams* FlattenLayerParams::New(::google::protobuf::Arena* arena) const {
  FlattenLayerParams* n = new FlattenLayerParams;
  if (arena != NULL) {
    arena->Own(n);
  }
  return n;
}